

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

void __thiscall Scene::~Scene(Scene *this)

{
  Material **ppMVar1;
  Material *pMVar2;
  Texture **ppTVar3;
  Texture *pTVar4;
  Object **ppOVar5;
  Object *pOVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = this->m_materials_size;
  if (0 < iVar7) {
    lVar8 = 0;
    do {
      ppMVar1 = this->m_materials;
      pMVar2 = ppMVar1[lVar8];
      if (pMVar2 != (Material *)0x0) {
        (*pMVar2->_vptr_Material[1])();
        ppMVar1[lVar8] = (Material *)0x0;
        iVar7 = this->m_materials_size;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar7);
  }
  if (this->m_materials != (Material **)0x0) {
    operator_delete__(this->m_materials);
    this->m_materials = (Material **)0x0;
  }
  iVar7 = this->m_textures_size;
  if (0 < iVar7) {
    lVar8 = 0;
    do {
      ppTVar3 = this->m_textures;
      pTVar4 = ppTVar3[lVar8];
      if (pTVar4 != (Texture *)0x0) {
        (*pTVar4->_vptr_Texture[1])();
        ppTVar3[lVar8] = (Texture *)0x0;
        iVar7 = this->m_textures_size;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar7);
  }
  if (this->m_textures != (Texture **)0x0) {
    operator_delete__(this->m_textures);
    this->m_textures = (Texture **)0x0;
  }
  iVar7 = this->m_objects_size;
  if (0 < iVar7) {
    lVar8 = 0;
    do {
      ppOVar5 = this->m_objects;
      pOVar6 = ppOVar5[lVar8];
      if (pOVar6 != (Object *)0x0) {
        (*pOVar6->_vptr_Object[1])();
        ppOVar5[lVar8] = (Object *)0x0;
        iVar7 = this->m_objects_size;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar7);
  }
  if (this->m_objects != (Object **)0x0) {
    operator_delete__(this->m_objects);
    this->m_objects = (Object **)0x0;
  }
  return;
}

Assistant:

Scene::~Scene()
{
    for(int i=0; i<m_materials_size; ++i) {
        safe_delete(m_materials[i]);
    }
    safe_array_delete(m_materials);

    for(int i=0; i<m_textures_size; ++i) {
        safe_delete(m_textures[i]);
    }
    safe_array_delete(m_textures);

    for(int i=0; i<m_objects_size; ++i) {
        safe_delete(m_objects[i]);
    }
    safe_array_delete(m_objects);
}